

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_tree.cpp
# Opt level: O2

bool __thiscall zmq::radix_tree_t::rm(radix_tree_t *this,uchar *key_,size_t key_size_)

{
  uint uVar1;
  int *piVar2;
  uchar first_byte_;
  node_t nVar3;
  node_t nVar4;
  ulong uVar5;
  node_t *this_00;
  node_t parent_node;
  node_t grandparent_node;
  node_t current_node;
  match_result_t match_result;
  node_t local_90;
  size_t local_88;
  node_t local_80;
  size_t local_78;
  node_t local_70;
  match_result_t local_68;
  
  match(&local_68,this,key_,key_size_,false);
  local_70._data = local_68._current_node._data;
  local_90._data = local_68._parent_node._data;
  local_80._data = local_68._grandparent_node._data;
  if (((local_68._key_bytes_matched == key_size_) &&
      (local_68._prefix_bytes_matched == *(uint *)(local_68._current_node._data + 4))) &&
     (*(int *)local_68._current_node._data != 0)) {
    *(int *)local_68._current_node._data = *(int *)local_68._current_node._data + -1;
    this->_size = this->_size - 1;
    if (*(int *)local_68._current_node._data == 0) {
      piVar2 = (int *)(this->_root)._data;
      if (piVar2 == (int *)local_68._current_node._data) {
        return true;
      }
      if (*(uint *)(local_68._current_node._data + 8) < 2) {
        if (*(uint *)(local_68._current_node._data + 8) == 1) {
          nVar3 = node_t::node_at(&local_70,0);
          uVar1 = *(uint *)(local_68._current_node._data + 4);
          node_t::resize(&local_70,(ulong)(*(int *)(nVar3._data + 4) + uVar1),
                         (ulong)*(uint *)(nVar3._data + 8));
          nVar4._data = local_70._data;
          memcpy(local_70._data + (ulong)uVar1 + 0xc,nVar3._data + 0xc,
                 (ulong)*(uint *)(nVar3._data + 4));
          memcpy(nVar4._data + (ulong)*(uint *)(nVar4._data + 4) + 0xc,
                 nVar3._data + (ulong)*(uint *)(nVar3._data + 4) + 0xc,
                 (ulong)*(uint *)(nVar4._data + 8));
          memcpy(nVar4._data +
                 (ulong)*(uint *)(nVar4._data + 8) + (ulong)*(uint *)(nVar4._data + 4) + 0xc,
                 nVar3._data +
                 (ulong)*(uint *)(nVar3._data + 8) + (ulong)*(uint *)(nVar3._data + 4) + 0xc,
                 (ulong)*(uint *)(nVar4._data + 8) << 3);
          *(int *)nVar4._data = *(int *)nVar3._data;
          free(nVar3._data);
          this_00 = &local_90;
        }
        else {
          local_88 = local_68._parent_edge_index;
          if (((*(int *)(local_68._parent_node._data + 8) == 2) &&
              (piVar2 != (int *)local_68._parent_node._data)) &&
             (*(int *)local_68._parent_node._data == 0)) {
            if (1 < local_68._edge_index) {
              fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","edge_index < 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/radix_tree.cpp"
                      ,0x1d7);
              fflush(_stderr);
              zmq_abort("edge_index < 2");
            }
            nVar3 = node_t::node_at(&local_90,(ulong)(local_68._edge_index == 0));
            uVar1 = *(uint *)(local_68._parent_node._data + 4);
            node_t::resize(&local_90,(ulong)(*(int *)(nVar3._data + 4) + uVar1),
                           (ulong)*(uint *)(nVar3._data + 8));
            nVar4._data = local_90._data;
            memcpy(local_90._data + (ulong)uVar1 + 0xc,nVar3._data + 0xc,
                   (ulong)*(uint *)(nVar3._data + 4));
            memcpy(nVar4._data + (ulong)*(uint *)(nVar4._data + 4) + 0xc,
                   nVar3._data + (ulong)*(uint *)(nVar3._data + 4) + 0xc,
                   (ulong)*(uint *)(nVar4._data + 8));
            memcpy(nVar4._data +
                   (ulong)*(uint *)(nVar4._data + 8) + (ulong)*(uint *)(nVar4._data + 4) + 0xc,
                   nVar3._data +
                   (ulong)*(uint *)(nVar3._data + 8) + (ulong)*(uint *)(nVar3._data + 4) + 0xc,
                   (ulong)*(uint *)(nVar4._data + 8) << 3);
            *(int *)nVar4._data = *(int *)nVar3._data;
            free(local_68._current_node._data);
            free(nVar3._data);
            this_00 = &local_80;
            local_68._edge_index = local_88;
          }
          else {
            uVar5 = (ulong)(*(int *)(local_68._parent_node._data + 8) - 1);
            local_78 = local_68._edge_index;
            first_byte_ = node_t::first_byte_at(&local_90,uVar5);
            nVar4 = node_t::node_at(&local_90,uVar5);
            node_t::set_edge_at(&local_90,local_78,first_byte_,nVar4);
            uVar5 = (ulong)*(uint *)(local_68._parent_node._data + 8);
            memmove(local_68._parent_node._data +
                    uVar5 + *(uint *)(local_68._parent_node._data + 4) + 0xb,
                    local_68._parent_node._data +
                    uVar5 + *(uint *)(local_68._parent_node._data + 4) + 0xc,uVar5 << 3);
            node_t::resize(&local_90,(ulong)*(uint *)(local_68._parent_node._data + 4),
                           (ulong)(*(int *)(local_68._parent_node._data + 8) - 1));
            free(local_68._current_node._data);
            if (*(int *)(local_90._data + 4) == 0) {
              (this->_root)._data = local_90._data;
              return true;
            }
            this_00 = &local_80;
            nVar4._data = local_90._data;
            local_68._edge_index = local_88;
          }
        }
        node_t::set_node_at(this_00,local_68._edge_index,nVar4);
        return true;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool zmq::radix_tree_t::rm (const unsigned char *key_, size_t key_size_)
{
    const match_result_t match_result = match (key_, key_size_);
    const size_t key_bytes_matched = match_result._key_bytes_matched;
    const size_t prefix_bytes_matched = match_result._prefix_bytes_matched;
    const size_t edge_index = match_result._edge_index;
    const size_t parent_edge_index = match_result._parent_edge_index;
    node_t current_node = match_result._current_node;
    node_t parent_node = match_result._parent_node;
    node_t grandparent_node = match_result._grandparent_node;

    if (key_bytes_matched != key_size_
        || prefix_bytes_matched != current_node.prefix_length ()
        || current_node.refcount () == 0)
        return false;

    current_node.set_refcount (current_node.refcount () - 1);
    --_size;
    if (current_node.refcount () > 0)
        return false;

    // Don't delete the root node.
    if (current_node == _root)
        return true;

    const size_t outgoing_edges = current_node.edgecount ();
    if (outgoing_edges > 1)
        // This node can't be merged with any other node, so there's
        // nothing more to do.
        return true;

    if (outgoing_edges == 1) {
        // Merge this node with the single child node.
        node_t child = current_node.node_at (0);

        // Make room for the child node's prefix and edges. We need to
        // keep the old prefix length since resize() will overwrite
        // it.
        const uint32_t old_prefix_length = current_node.prefix_length ();
        current_node.resize (old_prefix_length + child.prefix_length (),
                             child.edgecount ());

        // Append the child node's prefix to the current node.
        memcpy (current_node.prefix () + old_prefix_length, child.prefix (),
                child.prefix_length ());

        // Copy the rest of child node's data to the current node.
        current_node.set_first_bytes (child.first_bytes ());
        current_node.set_node_pointers (child.node_pointers ());
        current_node.set_refcount (child.refcount ());

        free (child._data);
        parent_node.set_node_at (edge_index, current_node);
        return true;
    }

    if (parent_node.edgecount () == 2 && parent_node.refcount () == 0
        && parent_node != _root) {
        // Removing this node leaves the parent with one child.
        // If the parent doesn't hold a key or if it isn't the root,
        // we can merge it with its single child node.
        zmq_assert (edge_index < 2);
        node_t other_child = parent_node.node_at (!edge_index);

        // Make room for the child node's prefix and edges. We need to
        // keep the old prefix length since resize() will overwrite
        // it.
        const uint32_t old_prefix_length = parent_node.prefix_length ();
        parent_node.resize (old_prefix_length + other_child.prefix_length (),
                            other_child.edgecount ());

        // Append the child node's prefix to the current node.
        memcpy (parent_node.prefix () + old_prefix_length,
                other_child.prefix (), other_child.prefix_length ());

        // Copy the rest of child node's data to the current node.
        parent_node.set_first_bytes (other_child.first_bytes ());
        parent_node.set_node_pointers (other_child.node_pointers ());
        parent_node.set_refcount (other_child.refcount ());

        free (current_node._data);
        free (other_child._data);
        grandparent_node.set_node_at (parent_edge_index, parent_node);
        return true;
    }

    // This is a leaf node that doesn't leave its parent with one
    // outgoing edge. Remove the outgoing edge to this node from the
    // parent.
    zmq_assert (outgoing_edges == 0);

    // Replace the edge to the current node with the last edge. An
    // edge consists of a byte and a pointer to the next node. First
    // replace the byte.
    const size_t last_index = parent_node.edgecount () - 1;
    const unsigned char last_byte = parent_node.first_byte_at (last_index);
    const node_t last_node = parent_node.node_at (last_index);
    parent_node.set_edge_at (edge_index, last_byte, last_node);

    // Move the chunk of pointers one byte to the left, effectively
    // deleting the last byte in the region of first bytes by
    // overwriting it.
    memmove (parent_node.node_pointers () - 1, parent_node.node_pointers (),
             parent_node.edgecount () * sizeof (void *));

    // Shrink the parent node to the new size, which "deletes" the
    // last pointer in the chunk of node pointers.
    parent_node.resize (parent_node.prefix_length (),
                        parent_node.edgecount () - 1);

    // Nothing points to this node now, so we can reclaim it.
    free (current_node._data);

    if (parent_node.prefix_length () == 0)
        _root._data = parent_node._data;
    else
        grandparent_node.set_node_at (parent_edge_index, parent_node);
    return true;
}